

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIFont::setMaxHeight(CGUIFont *this)

{
  u32 uVar1;
  int iVar2;
  rect<int> *this_00;
  array<irr::core::rect<int>_> *in_RDI;
  s32 t;
  u32 i;
  array<irr::core::rect<int>_> *p;
  uint index;
  uint local_14;
  
  if (in_RDI[3].m_data.
      super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    *(undefined4 *)
     ((long)&in_RDI[3].m_data.
             super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    (**(code **)(in_RDI[3].m_data.
                 super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->UpperLeftCorner)();
    local_14 = 0;
    while (index = local_14,
          uVar1 = core::array<irr::core::rect<int>_>::size((array<irr::core::rect<int>_> *)0x3b8fa3)
          , index < uVar1) {
      this_00 = core::array<irr::core::rect<int>_>::operator[](in_RDI,index);
      iVar2 = core::rect<int>::getHeight(this_00);
      if (*(int *)((long)&in_RDI[3].m_data.
                          super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) < iVar2) {
        *(int *)((long)&in_RDI[3].m_data.
                        super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = iVar2;
      }
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void CGUIFont::setMaxHeight()
{
	if (!SpriteBank)
		return;

	MaxHeight = 0;

	core::array<core::rect<s32>> &p = SpriteBank->getPositions();

	for (u32 i = 0; i < p.size(); ++i) {
		const s32 t = p[i].getHeight();
		if (t > MaxHeight)
			MaxHeight = t;
	}
}